

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

void print_fconfig_table(dlog_mt_fconfig_opts_t *fconfig_table)

{
  byte bVar1;
  
  printf("                             term_type: 0x%02x\n",(ulong)fconfig_table->term_type);
  printf("                       display_present: %d\n",(ulong)fconfig_table->display_present);
  printf("                      num_call_follows: %d\n",(ulong)fconfig_table->num_call_follows);
  printf("                         card_val_info: 0x%02x\t",(ulong)fconfig_table->card_val_info);
  print_bits(fconfig_table->card_val_info,auth_bits_str);
  putchar(10);
  printf("                        accs_mode_info: 0x%02x\t",(ulong)fconfig_table->accs_mode_info);
  print_bits(fconfig_table->accs_mode_info,accs_bits_str);
  putchar(10);
  printf("                    incoming_call_mode: 0x%02x\t%s\n",
         (ulong)fconfig_table->incoming_call_mode,
         call_mode_str[fconfig_table->incoming_call_mode & 3]);
  printf("          anti_fraud_for_incoming_call: 0x%02x\n",
         (ulong)fconfig_table->anti_fraud_for_incoming_call);
  printf("                        OOS_POTS_flags: 0x%02x\t",(ulong)fconfig_table->OOS_POTS_flags);
  print_bits(fconfig_table->OOS_POTS_flags,misc_flags_str);
  putchar(10);
  printf("                datajack_display_delay: %ds\n",
         (ulong)fconfig_table->datajack_display_delay);
  printf("                     lang_scroll_order: 0x%02x\n",(ulong)fconfig_table->lang_scroll_order)
  ;
  printf("                    lang_scroll_order2: 0x%02x\n",(ulong)fconfig_table->lang_scroll_order2
        );
  printf("                      num_of_languages: %d\n",(ulong)fconfig_table->num_of_languages);
  printf("                          rating_flags: 0x%02x\t",(ulong)fconfig_table->rating_flags);
  print_bits(fconfig_table->rating_flags,rating_flags_str);
  putchar(10);
  printf("                      dialaround_timer: %d\n",(ulong)fconfig_table->dialaround_timer);
  printf("       call_screen_list_ixl_oper_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_ixl_oper_entry);
  printf(" call_screen_list_inter_lata_aos_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_inter_lata_aos_entry);
  printf("        call_screen_list_ixl_aos_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_ixl_aos_entry);
  printf("                 datajack_grace_period: %d\n",(ulong)fconfig_table->datajack_grace_period)
  ;
  printf("             operator_collection_timer: %d\n",
         (ulong)fconfig_table->operator_collection_timer);
  printf("call_screen_list_intra_lata_oper_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_intra_lata_oper_entry);
  printf("call_screen_list_inter_lata_oper_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_inter_lata_oper_entry);
  printf("                     advertising_flags: 0x%02x\t",(ulong)fconfig_table->advertising_flags)
  ;
  print_bits(fconfig_table->advertising_flags,advertising_bits_str);
  putchar(10);
  printf("                      default_language: %d\n",(ulong)fconfig_table->default_language);
  printf("                call_setup_param_flags: 0x%02x\t",
         (ulong)fconfig_table->call_setup_param_flags);
  print_bits(fconfig_table->call_setup_param_flags,call_setup_flags_str);
  putchar(10);
  bVar1 = fconfig_table->dtmf_duration;
  printf("                         dtmf_duration: %d (%dms)\n",(ulong)bVar1,
         (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  bVar1 = fconfig_table->interdigit_pause;
  printf("                      interdigit_pause: %d (%dms)\n",(ulong)bVar1,
         (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  printf("              ppu_preauth_credit_limit: %d\n",
         (ulong)fconfig_table->ppu_preauth_credit_limit);
  printf("                 coin_calling_features: 0x%02x\t",
         (ulong)fconfig_table->coin_calling_features);
  print_bits(fconfig_table->coin_calling_features,coin_calling_features_str);
  putchar(10);
  printf("             coin_call_overtime_period: %ds\n",
         (ulong)fconfig_table->coin_call_overtime_period);
  printf("                   coin_call_pots_time: %ds\n",(ulong)fconfig_table->coin_call_pots_time);
  printf("              international_min_digits: %d\n",
         (ulong)fconfig_table->international_min_digits);
  printf("         default_rate_req_payment_type: %d\n",
         (ulong)fconfig_table->default_rate_req_payment_type);
  printf("      next_call_revalidation_frequency: %d\n",
         (ulong)fconfig_table->next_call_revalidation_frequency);
  bVar1 = fconfig_table->cutoff_on_disc_duration;
  printf("               cutoff_on_disc_duration: %d (%dms)\n",(ulong)bVar1,
         (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  printf("        cdr_upload_timer_international: %ds\n",
         (ulong)fconfig_table->cdr_upload_timer_international);
  printf("             cdr_upload_timer_domestic: %ds\n",
         (ulong)fconfig_table->cdr_upload_timer_domestic);
  printf("            num_perf_stat_dialog_fails: %d\n",
         (ulong)fconfig_table->num_perf_stat_dialog_fails);
  printf("               num_co_line_check_fails: %d\n",
         (ulong)fconfig_table->num_co_line_check_fails);
  printf("        num_alt_ncc_dialog_check_fails: %d\n",
         (ulong)fconfig_table->num_alt_ncc_dialog_check_fails);
  printf("          num_failed_dialogs_until_oos: %d\n",
         (ulong)fconfig_table->num_failed_dialogs_until_oos);
  printf("        num_failed_dialogs_until_alarm: %d\n",
         (ulong)fconfig_table->num_failed_dialogs_until_alarm);
  printf("                       smartcard_flags: 0x%02x\t",(ulong)fconfig_table->smartcard_flags);
  print_bits(fconfig_table->smartcard_flags,smartcard_flags_str);
  putchar(10);
  printf("      max_num_digits_manual_card_entry: %d\n",
         (ulong)fconfig_table->max_num_digits_manual_card_entry);
  printf("         call_screen_list_zp_aos_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_zp_aos_entry);
  printf("                 carrier_reroute_flags: 0x%02x\t",
         (ulong)fconfig_table->carrier_reroute_flags);
  print_bits(fconfig_table->carrier_reroute_flags,carrier_reroute_flags_str);
  putchar(10);
  printf("      min_num_digits_manual_card_entry: %d\n",
         (ulong)fconfig_table->min_num_digits_manual_card_entry);
  printf("             max_num_smartcard_inserts: %d\n",
         (ulong)fconfig_table->max_num_smartcard_inserts);
  printf("        max_num_diff_smartcard_inserts: %d\n",
         (ulong)fconfig_table->max_num_diff_smartcard_inserts);
  printf("         call_screen_list_zm_aos_entry: 0x%02x\n",
         (ulong)fconfig_table->call_screen_list_zm_aos_entry);
  printf("                        datajack_flags: 0x%02x\t",(ulong)fconfig_table->datajack_flags);
  print_bits(fconfig_table->datajack_flags,datajack_flags_str);
  putchar(10);
  printf("              delay_on_hook_card_alarm: %d\n",
         (ulong)fconfig_table->delay_on_hook_card_alarm);
  printf("   delay_on_hook_card_alarm_after_call: %d\n",
         (ulong)fconfig_table->delay_on_hook_card_alarm_after_call);
  printf("                duration_of_card_alarm: %d\n",(ulong)fconfig_table->duration_of_card_alarm
        );
  printf("                 card_alarm_on_cadence: %d\n",(ulong)fconfig_table->card_alarm_on_cadence)
  ;
  printf("                card_alarm_off_cadence: %d\n",(ulong)fconfig_table->card_alarm_off_cadence
        );
  printf("       card_reader_blocked_alarm_delay: %d\n",
         (ulong)fconfig_table->card_reader_blocked_alarm_delay);
  printf("                       settlement_time: %d\n",(ulong)fconfig_table->settlement_time);
  printf("                 grace_period_domestic: %d\n",(ulong)fconfig_table->grace_period_domestic)
  ;
  printf("                           ias_timeout: %d\n",(ulong)fconfig_table->ias_timeout);
  printf("            grace_period_international: %d\n",
         (ulong)fconfig_table->grace_period_international);
  printf("        settlement_time_datajack_calls: %d\n",
         (ulong)fconfig_table->settlement_time_datajack_calls);
  return;
}

Assistant:

extern void print_fconfig_table(dlog_mt_fconfig_opts_t* fconfig_table) {
    printf("                             term_type: 0x%02x\n", fconfig_table->term_type);
    printf("                       display_present: %d\n", fconfig_table->display_present);
    printf("                      num_call_follows: %d\n", fconfig_table->num_call_follows);
    printf("                         card_val_info: 0x%02x\t", fconfig_table->card_val_info);
    print_bits(fconfig_table->card_val_info, (char**)auth_bits_str);
    printf("\n");
    printf("                        accs_mode_info: 0x%02x\t", fconfig_table->accs_mode_info);
    print_bits(fconfig_table->accs_mode_info, (char**)accs_bits_str);
    printf("\n");
    printf("                    incoming_call_mode: 0x%02x\t%s\n",
        fconfig_table->incoming_call_mode, call_mode_str[(fconfig_table->incoming_call_mode) & 0x3]);
    printf("          anti_fraud_for_incoming_call: 0x%02x\n", fconfig_table->anti_fraud_for_incoming_call);
    printf("                        OOS_POTS_flags: 0x%02x\t", fconfig_table->OOS_POTS_flags);
    print_bits(fconfig_table->OOS_POTS_flags, (char**)misc_flags_str);
    printf("\n");
    printf("                datajack_display_delay: %ds\n", fconfig_table->datajack_display_delay);
    printf("                     lang_scroll_order: 0x%02x\n", fconfig_table->lang_scroll_order);
    printf("                    lang_scroll_order2: 0x%02x\n", fconfig_table->lang_scroll_order2);
    printf("                      num_of_languages: %d\n", fconfig_table->num_of_languages);
    printf("                          rating_flags: 0x%02x\t", fconfig_table->rating_flags);
    print_bits(fconfig_table->rating_flags, (char**)rating_flags_str);
    printf("\n");
    printf("                      dialaround_timer: %d\n", fconfig_table->dialaround_timer);
    printf("       call_screen_list_ixl_oper_entry: 0x%02x\n", fconfig_table->call_screen_list_ixl_oper_entry);
    printf(" call_screen_list_inter_lata_aos_entry: 0x%02x\n", fconfig_table->call_screen_list_inter_lata_aos_entry);
    printf("        call_screen_list_ixl_aos_entry: 0x%02x\n", fconfig_table->call_screen_list_ixl_aos_entry);
    printf("                 datajack_grace_period: %d\n", fconfig_table->datajack_grace_period);
    printf("             operator_collection_timer: %d\n", fconfig_table->operator_collection_timer);
    printf("call_screen_list_intra_lata_oper_entry: 0x%02x\n", fconfig_table->call_screen_list_intra_lata_oper_entry);
    printf("call_screen_list_inter_lata_oper_entry: 0x%02x\n", fconfig_table->call_screen_list_inter_lata_oper_entry);
    printf("                     advertising_flags: 0x%02x\t", fconfig_table->advertising_flags);
    print_bits(fconfig_table->advertising_flags, (char**)advertising_bits_str);
    printf("\n");
    printf("                      default_language: %d\n", fconfig_table->default_language);
    printf("                call_setup_param_flags: 0x%02x\t", fconfig_table->call_setup_param_flags);
    print_bits(fconfig_table->call_setup_param_flags, (char**)call_setup_flags_str);
    printf("\n");
    printf("                         dtmf_duration: %d (%dms)\n",
        fconfig_table->dtmf_duration, fconfig_table->dtmf_duration * 10);
    printf("                      interdigit_pause: %d (%dms)\n",
        fconfig_table->interdigit_pause, fconfig_table->interdigit_pause * 10);
    printf("              ppu_preauth_credit_limit: %d\n", fconfig_table->ppu_preauth_credit_limit);
    printf("                 coin_calling_features: 0x%02x\t", fconfig_table->coin_calling_features);
    print_bits(fconfig_table->coin_calling_features, (char**)coin_calling_features_str);
    printf("\n");
    printf("             coin_call_overtime_period: %ds\n", LE16(fconfig_table->coin_call_overtime_period));
    printf("                   coin_call_pots_time: %ds\n", LE16(fconfig_table->coin_call_pots_time));
    printf("              international_min_digits: %d\n", fconfig_table->international_min_digits);
    printf("         default_rate_req_payment_type: %d\n", fconfig_table->default_rate_req_payment_type);
    printf("      next_call_revalidation_frequency: %d\n", fconfig_table->next_call_revalidation_frequency);
    printf("               cutoff_on_disc_duration: %d (%dms)\n",
        fconfig_table->cutoff_on_disc_duration, fconfig_table->cutoff_on_disc_duration * 10);
    printf("        cdr_upload_timer_international: %ds\n", LE16(fconfig_table->cdr_upload_timer_international));
    printf("             cdr_upload_timer_domestic: %ds\n", LE16(fconfig_table->cdr_upload_timer_domestic));
    printf("            num_perf_stat_dialog_fails: %d\n", fconfig_table->num_perf_stat_dialog_fails);
    printf("               num_co_line_check_fails: %d\n", fconfig_table->num_co_line_check_fails);
    printf("        num_alt_ncc_dialog_check_fails: %d\n", fconfig_table->num_alt_ncc_dialog_check_fails);
    printf("          num_failed_dialogs_until_oos: %d\n", fconfig_table->num_failed_dialogs_until_oos);
    printf("        num_failed_dialogs_until_alarm: %d\n", fconfig_table->num_failed_dialogs_until_alarm);
    printf("                       smartcard_flags: 0x%02x\t", fconfig_table->smartcard_flags);
    print_bits(fconfig_table->smartcard_flags, (char**)smartcard_flags_str);
    printf("\n");
    printf("      max_num_digits_manual_card_entry: %d\n", fconfig_table->max_num_digits_manual_card_entry);
    printf("         call_screen_list_zp_aos_entry: 0x%02x\n", fconfig_table->call_screen_list_zp_aos_entry);
    printf("                 carrier_reroute_flags: 0x%02x\t", fconfig_table->carrier_reroute_flags);
    print_bits(fconfig_table->carrier_reroute_flags, (char**)carrier_reroute_flags_str);
    printf("\n");
    printf("      min_num_digits_manual_card_entry: %d\n", fconfig_table->min_num_digits_manual_card_entry);
    printf("             max_num_smartcard_inserts: %d\n", fconfig_table->max_num_smartcard_inserts);
    printf("        max_num_diff_smartcard_inserts: %d\n", fconfig_table->max_num_diff_smartcard_inserts);
    printf("         call_screen_list_zm_aos_entry: 0x%02x\n", fconfig_table->call_screen_list_zm_aos_entry);
    printf("                        datajack_flags: 0x%02x\t", fconfig_table->datajack_flags);
    print_bits(fconfig_table->datajack_flags, (char**)datajack_flags_str);
    printf("\n");
    printf("              delay_on_hook_card_alarm: %d\n", LE16(fconfig_table->delay_on_hook_card_alarm));
    printf("   delay_on_hook_card_alarm_after_call: %d\n", LE16(fconfig_table->delay_on_hook_card_alarm_after_call));
    printf("                duration_of_card_alarm: %d\n", LE16(fconfig_table->duration_of_card_alarm));
    printf("                 card_alarm_on_cadence: %d\n", LE16(fconfig_table->card_alarm_on_cadence));
    printf("                card_alarm_off_cadence: %d\n", LE16(fconfig_table->card_alarm_off_cadence));
    printf("       card_reader_blocked_alarm_delay: %d\n", LE16(fconfig_table->card_reader_blocked_alarm_delay));
    printf("                       settlement_time: %d\n", fconfig_table->settlement_time);
    printf("                 grace_period_domestic: %d\n", fconfig_table->grace_period_domestic);
    printf("                           ias_timeout: %d\n", fconfig_table->ias_timeout);
    printf("            grace_period_international: %d\n", fconfig_table->grace_period_international);
    printf("        settlement_time_datajack_calls: %d\n", fconfig_table->settlement_time_datajack_calls);

}